

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O3

uint8_t * DecodeIntoRGBABuffer
                    (WEBP_CSP_MODE colorspace,uint8_t *data,size_t data_size,uint8_t *rgba,
                    int stride,size_t size)

{
  int iVar1;
  VP8StatusCode VVar2;
  uint8_t *puVar3;
  WebPDecBuffer buf;
  WebPDecBuffer local_118;
  WebPDecParams local_a0;
  
  if ((rgba == (uint8_t *)0x0) || (iVar1 = WebPInitDecBufferInternal(&local_118,0x210), iVar1 == 0))
  {
    puVar3 = (uint8_t *)0x0;
  }
  else {
    local_a0.emit = (OutputFunc)0x0;
    local_a0.emit_alpha = (OutputAlphaFunc)0x0;
    local_a0.scaler_a = (WebPRescaler *)0x0;
    local_a0.memory = (void *)0x0;
    local_a0.scaler_u = (WebPRescaler *)0x0;
    local_a0.scaler_v = (WebPRescaler *)0x0;
    local_a0.options = (WebPDecoderOptions *)0x0;
    local_a0.scaler_y = (WebPRescaler *)0x0;
    local_a0.tmp_v = (uint8_t *)0x0;
    local_a0.last_y = 0;
    local_a0._36_4_ = 0;
    local_a0.tmp_y = (uint8_t *)0x0;
    local_a0.tmp_u = (uint8_t *)0x0;
    local_a0.emit_alpha_row = (OutputRowFunc)0x0;
    local_118.is_external_memory = 1;
    local_118.colorspace = colorspace;
    local_118.u.RGBA.rgba = rgba;
    local_118.u.RGBA.stride = stride;
    local_118.u.RGBA.size = size;
    local_a0.output = &local_118;
    VVar2 = DecodeInto(data,data_size,&local_a0);
    puVar3 = (uint8_t *)0x0;
    if (VVar2 == VP8_STATUS_OK) {
      puVar3 = rgba;
    }
  }
  return puVar3;
}

Assistant:

WEBP_NODISCARD static uint8_t* DecodeIntoRGBABuffer(WEBP_CSP_MODE colorspace,
                                                    const uint8_t* const data,
                                                    size_t data_size,
                                                    uint8_t* const rgba,
                                                    int stride, size_t size) {
  WebPDecParams params;
  WebPDecBuffer buf;
  if (rgba == NULL || !WebPInitDecBuffer(&buf)) {
    return NULL;
  }
  WebPResetDecParams(&params);
  params.output = &buf;
  buf.colorspace    = colorspace;
  buf.u.RGBA.rgba   = rgba;
  buf.u.RGBA.stride = stride;
  buf.u.RGBA.size   = size;
  buf.is_external_memory = 1;
  if (DecodeInto(data, data_size, &params) != VP8_STATUS_OK) {
    return NULL;
  }
  return rgba;
}